

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall ON_BinaryArchive::BeginWrite3dmTable(ON_BinaryArchive *this,uint typecode)

{
  bool bVar1;
  ON_3dmArchiveTableType table;
  ON_3dmArchiveTableType OVar2;
  int iVar3;
  bool local_21;
  bool rc;
  ON_3dmArchiveTableType tt;
  uint typecode_local;
  ON_BinaryArchive *this_local;
  
  if (typecode == 0) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
               ,0x2284,"","ON_BinaryArchive::BeginWrite3dmTable() bad typecode");
    this_local._7_1_ = false;
  }
  else {
    table = TableTypeFromTypecode(this,typecode);
    if (table == Unset) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                 ,0x228a,"","ON_BinaryArchive::BeginWrite3dmTable() bad typecode");
      this_local._7_1_ = false;
    }
    else {
      OVar2 = Active3dmTable(this);
      if (OVar2 == Unset) {
        iVar3 = ON_SimpleArray<ON_3DM_BIG_CHUNK>::Count(&this->m_chunk);
        if (iVar3 == 0) {
          bVar1 = Begin3dmTable(this,write3dm,table);
          if (bVar1) {
            bVar1 = ArchiveContains3dmTable(this,table);
            if (bVar1) {
              local_21 = BeginWrite3dmChunk(this,typecode,0);
              if (!local_21) {
                End3dmTable(this,table,false);
              }
            }
            else {
              local_21 = true;
            }
            this_local._7_1_ = local_21;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                     ,0x2294,"","ON_BinaryArchive::BeginWrite3dmTable() m_chunk.Count() != 0");
          this_local._7_1_ = false;
        }
      }
      else {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
                   ,0x228f,"",
                   "ON_BinaryArchive::BeginWrite3dmTable() m_active_table != no_active_table");
        this_local._7_1_ = false;
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_BinaryArchive::BeginWrite3dmTable( unsigned int typecode )
{
  if (0 == typecode)
  {
    ON_ERROR("ON_BinaryArchive::BeginWrite3dmTable() bad typecode");
    return false;
  }
  const ON_3dmArchiveTableType tt = TableTypeFromTypecode(typecode);
  if (tt == ON_3dmArchiveTableType::Unset) 
  {
    ON_ERROR("ON_BinaryArchive::BeginWrite3dmTable() bad typecode");
    return false;
  }
  if ( Active3dmTable() != ON_3dmArchiveTableType::Unset )
  {
    ON_ERROR("ON_BinaryArchive::BeginWrite3dmTable() m_active_table != no_active_table");
    return false;
  }
  if ( 0 != m_chunk.Count() ) 
  {
    ON_ERROR("ON_BinaryArchive::BeginWrite3dmTable() m_chunk.Count() != 0");
    return false;
  }
  if (false == Begin3dmTable(ON::archive_mode::write3dm,tt))
    return false;

  bool rc;
  if (ArchiveContains3dmTable(tt))
  {
    rc = BeginWrite3dmChunk(typecode, 0);
    if (false == rc)
      End3dmTable(tt, false);
  }
  else
    rc = true;

  return rc;
}